

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * CreateConditionCast(ExpressionContext *ctx,SynBase *source,ExprBase *value)

{
  TypeBase *pTVar1;
  undefined8 uVar2;
  uint uVar3;
  TypeStruct *pTVar4;
  SynBase *pSVar5;
  undefined4 extraout_var;
  ExprBase *pEVar6;
  ExprError *pEVar7;
  undefined4 extraout_var_00;
  undefined4 in_ECX;
  int iVar8;
  int iVar10;
  undefined1 auVar9 [16];
  InplaceStr name;
  
  pTVar4 = (TypeStruct *)value->type;
  if ((pTVar4 != (TypeStruct *)0x0) && ((pTVar4->super_TypeBase).typeID == 0)) {
    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar8);
    pTVar1 = ctx->typeBool;
    pEVar6->typeID = 0x12;
    pEVar6->source = source;
    pEVar6->type = pTVar1;
    pEVar6->next = (ExprBase *)0x0;
    pEVar6->listed = false;
    pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002239e8;
    pEVar6[1]._vptr_ExprBase = (_func_int **)value;
    pEVar6[1].typeID = 0xd;
    return pEVar6;
  }
  pTVar1 = ctx->typeBool;
  uVar2 = ctx->typeChar;
  iVar8 = (int)pTVar4;
  iVar10 = (int)((ulong)pTVar4 >> 0x20);
  auVar9._0_4_ = -(uint)(iVar10 == (int)((ulong)pTVar1 >> 0x20) && iVar8 == (int)pTVar1);
  auVar9._4_4_ = -(uint)(iVar8 == (int)uVar2 && iVar10 == (int)((ulong)uVar2 >> 0x20));
  auVar9._8_4_ = -(uint)(*(int *)((long)&ctx->typeShort + 4) == iVar10 &&
                        *(int *)&ctx->typeShort == iVar8);
  auVar9._12_4_ =
       -(uint)(*(int *)&ctx->typeInt == iVar8 && *(int *)((long)&ctx->typeInt + 4) == iVar10);
  iVar8 = movmskps(in_ECX,auVar9);
  if (((iVar8 == 0) && ((TypeStruct *)ctx->typeLong != pTVar4)) &&
     ((pTVar4->super_TypeBase).isGeneric == false)) {
    if ((((TypeStruct *)ctx->typeFloat != pTVar4) && ((TypeStruct *)ctx->typeDouble != pTVar4)) &&
       ((uVar3 = (pTVar4->super_TypeBase).typeID, uVar3 != 0x15 &&
        ((uVar3 != 0x14 && (uVar3 != 0x12)))))) {
      if (pTVar4 == ctx->typeAutoRef) {
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_00,iVar8);
        pSVar5 = value->source;
        pTVar1 = ctx->typeNullPtr;
        pEVar6->typeID = 9;
        pEVar6->source = pSVar5;
        pEVar6->type = pTVar1;
        pEVar6->next = (ExprBase *)0x0;
        pEVar6->listed = false;
        pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002235f0;
        pEVar6 = CreateBinaryOp(ctx,source,SYN_BINARY_OP_NOT_EQUAL,value,pEVar6);
        return pEVar6;
      }
      name.end = "";
      name.begin = "bool";
      pEVar6 = CreateFunctionCall1(ctx,source,name,value,true,false,false);
      if (pEVar6 != (ExprBase *)0x0) {
        return pEVar6;
      }
      pEVar7 = anon_unknown.dwarf_9c70f::ReportExpected
                         (ctx,source,ctx->typeBool,
                          "ERROR: condition type cannot be \'%.*s\' and function for conversion to bool is undefined"
                          ,(ulong)(uint)(*(int *)&(value->type->name).end -
                                        (int)(value->type->name).begin));
      return &pEVar7->super_ExprBase;
    }
  }
  else {
    AssertValueExpression(ctx,source,value);
    if (value->type != ctx->typeLong) {
      return value;
    }
    pTVar1 = ctx->typeBool;
  }
  pEVar6 = CreateCast(ctx,source,value,pTVar1,false);
  return pEVar6;
}

Assistant:

ExprBase* CreateConditionCast(ExpressionContext &ctx, SynBase *source, ExprBase *value)
{
	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, ctx.typeBool, value, EXPR_CAST_REINTERPRET);

	if(!ctx.IsIntegerType(value->type) && !value->type->isGeneric)
	{
		// TODO: function overload

		if(ctx.IsFloatingPointType(value->type))
			return CreateCast(ctx, source, value, ctx.typeBool, false);

		if(isType<TypeRef>(value->type))
			return CreateCast(ctx, source, value, ctx.typeBool, false);

		if(isType<TypeUnsizedArray>(value->type))
			return CreateCast(ctx, source, value, ctx.typeBool, false);

		if(isType<TypeFunction>(value->type))
			return CreateCast(ctx, source, value, ctx.typeBool, false);

		if(value->type == ctx.typeAutoRef)
		{
			ExprBase *nullPtr = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(value->source, ctx.typeNullPtr);

			return CreateBinaryOp(ctx, source, SYN_BINARY_OP_NOT_EQUAL, value, nullPtr);
		}
		else
		{
			if(ExprBase *call = CreateFunctionCall1(ctx, source, InplaceStr("bool"), value, true, false, false))
				return call;

			return ReportExpected(ctx, source, ctx.typeBool, "ERROR: condition type cannot be '%.*s' and function for conversion to bool is undefined", FMT_ISTR(value->type->name));
		}
	}

	AssertValueExpression(ctx, source, value);

	if(value->type == ctx.typeLong)
		value = CreateCast(ctx, source, value, ctx.typeBool, false);

	return value;
}